

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall Buffer_add_Test::Buffer_add_Test(Buffer_add_Test *this)

{
  Buffer_add_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Buffer_add_Test_001ed728;
  return;
}

Assistant:

TEST(Buffer, add) {
    auto buf = bfy_buffer_init();

    char constexpr ch = 'y';
    EXPECT_EQ(0, bfy_buffer_add_ch(&buf, ch));
    EXPECT_EQ(1, bfy_buffer_get_content_len(&buf));
    EXPECT_EQ(1, buffer_count_pages(&buf));

    bfy_buffer_destruct(&buf);
}